

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

void __thiscall
edition_unittest::TestUnpackedExtensions::~TestUnpackedExtensions(TestUnpackedExtensions *this)

{
  TestUnpackedExtensions *this_local;
  
  ~TestUnpackedExtensions(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

TestUnpackedExtensions::~TestUnpackedExtensions() {
  // @@protoc_insertion_point(destructor:edition_unittest.TestUnpackedExtensions)
  SharedDtor(*this);
}